

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindFieldByCamelcaseName
          (FileDescriptorTables *this,void *parent,string *camelcase_name)

{
  second_type pFVar1;
  first_type local_30;
  
  local_30.first = this;
  std::
  call_once<void(&)(google::protobuf::FileDescriptorTables_const*),google::protobuf::FileDescriptorTables_const*>
            (&this->fields_by_camelcase_name_once_,FieldsByCamelcaseNamesLazyInitStatic,
             (FileDescriptorTables **)&local_30);
  local_30.second = (camelcase_name->_M_dataplus)._M_p;
  local_30.first = parent;
  pFVar1 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
                     (&this->fields_by_camelcase_name_,&local_30);
  return pFVar1;
}

Assistant:

inline const FieldDescriptor* FileDescriptorTables::FindFieldByCamelcaseName(
    const void* parent, const std::string& camelcase_name) const {
  internal::call_once(
      fields_by_camelcase_name_once_,
      FileDescriptorTables::FieldsByCamelcaseNamesLazyInitStatic, this);
  return FindPtrOrNull(fields_by_camelcase_name_,
                            PointerStringPair(parent, camelcase_name.c_str()));
}